

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_lib.cc
# Opt level: O3

int PEM_read(FILE *fp,char **name,char **header,uchar **data,long *len)

{
  int iVar1;
  BIO *bp;
  
  bp = BIO_new_fp(fp,0);
  if (bp == (BIO *)0x0) {
    ERR_put_error(9,0,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_lib.cc"
                  ,0x21f);
    iVar1 = 0;
  }
  else {
    iVar1 = PEM_read_bio(bp,name,header,data,len);
    BIO_free(bp);
  }
  return iVar1;
}

Assistant:

int PEM_read(FILE *fp, char **name, char **header, unsigned char **data,
             long *len) {
  BIO *b = BIO_new_fp(fp, BIO_NOCLOSE);
  if (b == NULL) {
    OPENSSL_PUT_ERROR(PEM, ERR_R_BUF_LIB);
    return 0;
  }
  int ret = PEM_read_bio(b, name, header, data, len);
  BIO_free(b);
  return ret;
}